

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::FloatConstantGenerator::GenFloatConstantImpl<double>
          (string *__return_storage_ptr__,FloatConstantGenerator *this,FieldDef *field)

{
  uint uVar1;
  char *s;
  allocator<char> local_32;
  undefined1 local_31;
  double dStack_30;
  bool done;
  double v;
  string *constant;
  FieldDef *field_local;
  FloatConstantGenerator *this_local;
  
  v = (double)&(field->value).constant;
  constant = (string *)field;
  field_local = (FieldDef *)this;
  this_local = (FloatConstantGenerator *)__return_storage_ptr__;
  s = (char *)std::__cxx11::string::c_str();
  local_31 = StringToNumber<double>(s,&stack0xffffffffffffffd0);
  if ((bool)local_31) {
    if ((bool)local_31) {
      uVar1 = std::isnan(dStack_30);
      if ((uVar1 & 1) == 0) {
        uVar1 = std::isinf(dStack_30);
        if ((uVar1 & 1) == 0) {
          (*this->_vptr_FloatConstantGenerator[2])(dStack_30,__return_storage_ptr__,this,v);
        }
        else {
          (*this->_vptr_FloatConstantGenerator[3])(dStack_30,__return_storage_ptr__);
        }
      }
      else {
        (*this->_vptr_FloatConstantGenerator[4])(dStack_30,__return_storage_ptr__);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"#",&local_32);
      std::allocator<char>::~allocator(&local_32);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("done",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/code_generators.cpp"
                ,0xe0,
                "std::string flatbuffers::FloatConstantGenerator::GenFloatConstantImpl(const FieldDef &) const [T = double]"
               );
}

Assistant:

std::string FloatConstantGenerator::GenFloatConstantImpl(
    const FieldDef &field) const {
  const auto &constant = field.value.constant;
  T v;
  auto done = StringToNumber(constant.c_str(), &v);
  FLATBUFFERS_ASSERT(done);
  if (done) {
#if (!defined(_MSC_VER) || (_MSC_VER >= 1800))
    if (std::isnan(v)) return NaN(v);
    if (std::isinf(v)) return Inf(v);
#endif
    return Value(v, constant);
  }
  return "#";  // compile time error
}